

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O2

int div64(uint64_t *plow,uint64_t *phigh,uint64_t b)

{
  ulong uVar1;
  uint64_t uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar1 = *plow;
  uVar5 = *phigh;
  if (uVar5 == 0) {
    uVar4 = uVar1 / b;
    uVar5 = uVar1 % b;
  }
  else {
    if (b <= uVar5) {
      return 1;
    }
    iVar3 = 0x40;
    while (bVar6 = iVar3 != 0, iVar3 = iVar3 + -1, uVar4 = uVar1, bVar6) {
      uVar4 = uVar5 << 1 | uVar1 >> 0x3f;
      bVar6 = (long)uVar5 < 0;
      uVar2 = 0;
      if (b <= uVar4 || bVar6) {
        uVar2 = b;
      }
      uVar5 = uVar4 - uVar2;
      uVar1 = (ulong)(b <= uVar4 || bVar6) + uVar1 * 2;
    }
  }
  *plow = uVar4;
  *phigh = uVar5;
  return 0;
}

Assistant:

static int div64(uint64_t *plow, uint64_t *phigh, uint64_t b)
{
    uint64_t q, r, a1, a0;
    int i, qb, ab;

    a0 = *plow;
    a1 = *phigh;
    if (a1 == 0) {
        q = a0 / b;
        r = a0 % b;
        *plow = q;
        *phigh = r;
    } else {
        if (a1 >= b) {
            return 1;
        }
        /* XXX: use a better algorithm */
        for (i = 0; i < 64; i++) {
            ab = a1 >> 63;
            a1 = (a1 << 1) | (a0 >> 63);
            if (ab || a1 >= b) {
                a1 -= b;
                qb = 1;
            } else {
                qb = 0;
            }
            a0 = (a0 << 1) | qb;
        }
#if defined(DEBUG_MULDIV)
        printf("div: 0x%016" PRIx64 "%016" PRIx64 " / 0x%016" PRIx64
               ": q=0x%016" PRIx64 " r=0x%016" PRIx64 "\n",
               *phigh, *plow, b, a0, a1);
#endif
        *plow = a0;
        *phigh = a1;
    }
    return 0;
}